

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall wallet::LegacyScriptPubKeyMan::RewriteDB(LegacyScriptPubKeyMan *this)

{
  long in_FS_OFFSET;
  AnnotatedMixin<std::recursive_mutex> *unaff_retaddr;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_00000008;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
  *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffeb;
  int in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  char *pszName;
  
  pszName = *(char **)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffffc8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_00000008,unaff_retaddr,pszName,in_stack_fffffffffffffff0,
             in_stack_ffffffffffffffec,(bool)in_stack_ffffffffffffffeb);
  std::set<long,_std::less<long>,_std::allocator<long>_>::clear
            ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_ffffffffffffffc8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::clear
            ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_ffffffffffffffc8);
  std::map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::clear
            (in_stack_ffffffffffffffc8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffffc8);
  if (*(char **)(in_FS_OFFSET + 0x28) == pszName) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::RewriteDB()
{
    LOCK(cs_KeyStore);
    setInternalKeyPool.clear();
    setExternalKeyPool.clear();
    m_pool_key_to_index.clear();
    // Note: can't top-up keypool here, because wallet is locked.
    // User will be prompted to unlock wallet the next operation
    // that requires a new key.
}